

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeDataViewConstructor
               (DynamicObject *dataViewConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  undefined8 in_RAX;
  uint uVar2;
  PropertyString *pPVar1;
  ulong uVar3;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,dataViewConstructor,mode,3,0);
  this = (((((dataViewConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
  uVar3 = (ulong)uVar2 << 0x20;
  (*(dataViewConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (dataViewConstructor,0xd1,&DAT_1000000000003,2,0,0,uVar3);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(dataViewConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (dataViewConstructor,0x124,
             (((this->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             dataViewPrototype.ptr,0,0,0,uVar3);
  pPVar1 = ScriptContext::GetPropertyString(this,0x1ba);
  (*(dataViewConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (dataViewConstructor,0x106,pPVar1,2,0,0,uVar3 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(dataViewConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeDataViewConstructor(DynamicObject* dataViewConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(dataViewConstructor, mode, 3);

        ScriptContext* scriptContext = dataViewConstructor->GetScriptContext();
        JavascriptLibrary* library = dataViewConstructor->GetLibrary();
        library->AddMember(dataViewConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(3), PropertyConfigurable);
        library->AddMember(dataViewConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->dataViewPrototype, PropertyNone);
        library->AddMember(dataViewConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::DataView), PropertyConfigurable);

        dataViewConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }